

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int rtreeClose(sqlite3_vtab_cursor *cur)

{
  char **ppcVar1;
  sqlite3_vtab *psVar2;
  sqlite3_blob *pBlob;
  
  psVar2 = cur->pVtab;
  resetCursor((RtreeCursor *)cur);
  sqlite3_finalize((sqlite3_stmt *)cur[7].pVtab);
  sqlite3_free(cur);
  ppcVar1 = &psVar2[3].zErrMsg;
  *(int *)ppcVar1 = *(int *)ppcVar1 + -1;
  if ((*(int *)ppcVar1 == 0) && (*(char *)&psVar2[1].zErrMsg == '\0')) {
    pBlob = (sqlite3_blob *)psVar2[4].zErrMsg;
    psVar2[4].zErrMsg = (char *)0x0;
    sqlite3_blob_close(pBlob);
  }
  return 0;
}

Assistant:

static int rtreeClose(sqlite3_vtab_cursor *cur){
  Rtree *pRtree = (Rtree *)(cur->pVtab);
  RtreeCursor *pCsr = (RtreeCursor *)cur;
  assert( pRtree->nCursor>0 );
  resetCursor(pCsr);
  sqlite3_finalize(pCsr->pReadAux);
  sqlite3_free(pCsr);
  pRtree->nCursor--;
  if( pRtree->nCursor==0 && pRtree->inWrTrans==0 ){
    nodeBlobReset(pRtree);
  }
  return SQLITE_OK;
}